

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O3

Real __thiscall amrex::MultiFab::max(MultiFab *this,int comp,int nghost,bool local)

{
  FabFactory<amrex::FArrayBox> *pFVar1;
  FabType FVar2;
  long lVar3;
  FabArray<amrex::EBCellFlagFab> *this_00;
  int *piVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  MFIter mfi;
  double local_178;
  Box local_154;
  long local_138;
  FabArray<amrex::EBCellFlagFab> *local_130;
  long local_128;
  long local_120;
  long local_118;
  Array4<const_double> local_110;
  Array4<const_amrex::EBCellFlag> local_d0;
  MFIter local_90;
  
  pFVar1 = (this->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  if ((pFVar1 == (FabFactory<amrex::FArrayBox> *)0x0) ||
     (lVar3 = __dynamic_cast(pFVar1,&FabFactory<amrex::FArrayBox>::typeinfo,
                             &EBFArrayBoxFactory::typeinfo,0), lVar3 == 0)) {
    MFIter::MFIter(&local_90,(FabArrayBase *)this,true);
    if (local_90.currentIndex < local_90.endIndex) {
      local_178 = -1.79769313486232e+308;
      do {
        MFIter::growntilebox((Box *)&local_110,&local_90,nghost);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&local_d0,&this->super_FabArray<amrex::FArrayBox>,
                   &local_90);
        lVar3 = (long)(int)local_110.jstride;
        if ((int)local_110.jstride <= local_110.kstride._4_4_) {
          lVar7 = (long)&local_d0.p[(long)local_d0.begin.x * -2 + (long)(int)local_110.p * 2].flag +
                  local_d0.nstride * (long)comp * 8 +
                  ((long)local_110.p._4_4_ - (long)local_d0.begin.y) * local_d0.jstride * 8 +
                  (lVar3 - local_d0.begin.z) * local_d0.kstride * 8;
          do {
            lVar9 = lVar7;
            lVar11 = (long)local_110.p._4_4_;
            if (local_110.p._4_4_ <= (int)local_110.kstride) {
              do {
                if ((int)local_110.p <= local_110.jstride._4_4_) {
                  lVar5 = 0;
                  dVar12 = local_178;
                  do {
                    local_178 = *(double *)(lVar9 + lVar5 * 8);
                    if (local_178 <= dVar12) {
                      local_178 = dVar12;
                    }
                    lVar5 = lVar5 + 1;
                    dVar12 = local_178;
                  } while ((local_110.jstride._4_4_ - (int)local_110.p) + 1 != (int)lVar5);
                }
                lVar11 = lVar11 + 1;
                lVar9 = lVar9 + local_d0.jstride * 8;
              } while ((int)local_110.kstride + 1 != (int)lVar11);
            }
            lVar3 = lVar3 + 1;
            lVar7 = lVar7 + local_d0.kstride * 8;
          } while (local_110.kstride._4_4_ + 1 != (int)lVar3);
        }
        MFIter::operator++(&local_90);
      } while (local_90.currentIndex < local_90.endIndex);
      goto LAB_00464157;
    }
  }
  else {
    this_00 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar3 + 0xd8));
    MFIter::MFIter(&local_90,(FabArrayBase *)this,true);
    if (local_90.currentIndex < local_90.endIndex) {
      local_138 = (long)comp << 3;
      local_178 = -1.79769313486232e+308;
      local_130 = this_00;
      do {
        MFIter::growntilebox(&local_154,&local_90,nghost);
        piVar4 = &local_90.currentIndex;
        if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar4 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start + local_90.currentIndex;
        }
        FVar2 = EBCellFlagFab::getType
                          ((this_00->m_fabs_v).
                           super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[*piVar4],&local_154);
        if (FVar2 != covered) {
          FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                    (&local_d0,this_00,&local_90);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_110,&this->super_FabArray<amrex::FArrayBox>,&local_90);
          lVar3 = (long)local_154.smallend.vect[2];
          this_00 = local_130;
          if (local_154.smallend.vect[2] <= local_154.bigend.vect[2]) {
            local_118 = (long)local_154.smallend.vect[1];
            local_120 = CONCAT44(local_110.kstride._4_4_,(int)local_110.kstride) * 8;
            lVar9 = CONCAT44(local_110.jstride._4_4_,(int)local_110.jstride) * 8;
            local_128 = local_d0.kstride * 4;
            lVar7 = local_110.nstride * local_138 +
                    (local_118 - local_110.begin.y) * lVar9 +
                    (lVar3 - local_110.begin.z) * local_120 + (long)local_154.smallend.vect[0] * 8 +
                    (long)local_110.begin.x * -8 + CONCAT44(local_110.p._4_4_,(int)local_110.p);
            lVar11 = (long)&local_d0.p[(long)local_154.smallend.vect[0] - (long)local_d0.begin.x].
                            flag +
                     (local_118 - local_d0.begin.y) * local_d0.jstride * 4 +
                     (lVar3 - local_d0.begin.z) * local_128;
            do {
              lVar5 = lVar11;
              lVar6 = lVar7;
              lVar8 = local_118;
              if (local_154.smallend.vect[1] <= local_154.bigend.vect[1]) {
                do {
                  if (local_154.smallend.vect[0] <= local_154.bigend.vect[0]) {
                    lVar10 = 0;
                    dVar12 = local_178;
                    do {
                      local_178 = dVar12;
                      if (((~*(uint *)(lVar5 + lVar10 * 4) & 3) != 0) &&
                         (local_178 = *(double *)(lVar6 + lVar10 * 8), local_178 <= dVar12)) {
                        local_178 = dVar12;
                      }
                      lVar10 = lVar10 + 1;
                      dVar12 = local_178;
                    } while ((local_154.bigend.vect[0] - local_154.smallend.vect[0]) + 1 !=
                             (int)lVar10);
                  }
                  lVar8 = lVar8 + 1;
                  lVar6 = lVar6 + lVar9;
                  lVar5 = lVar5 + local_d0.jstride * 4;
                } while (local_154.bigend.vect[1] + 1 != (int)lVar8);
              }
              lVar3 = lVar3 + 1;
              lVar7 = lVar7 + local_120;
              lVar11 = lVar11 + local_128;
            } while (local_154.bigend.vect[2] + 1 != (int)lVar3);
          }
        }
        MFIter::operator++(&local_90);
      } while (local_90.currentIndex < local_90.endIndex);
      goto LAB_00464157;
    }
  }
  local_178 = -1.79769313486232e+308;
LAB_00464157:
  MFIter::~MFIter(&local_90);
  return local_178;
}

Assistant:

Real
MultiFab::max (int comp, int nghost, bool local) const
{
    BL_ASSERT(nghost >= 0 && nghost <= n_grow.min());

    BL_PROFILE("MultiFab::max()");

    Real mx = std::numeric_limits<Real>::lowest();

#ifdef AMREX_USE_EB
    if ( this->hasEBFabFactory() )
    {
        const auto& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(this->Factory());
        auto const& flags = ebfactory.getMultiEBCellFlagFab();
#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion()) {
            auto const& flagsma = flags.const_arrays();
            auto const& ma = this->const_arrays();
            mx = ParReduce(TypeList<ReduceOpMax>{}, TypeList<Real>{}, *this, IntVect(nghost),
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Real>
            {
                if (flagsma[box_no](i,j,k).isCovered()) {
                    return AMREX_REAL_LOWEST;
                } else {
                    return ma[box_no](i,j,k,comp);
                }
            });
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:mx)
#endif
            for (MFIter mfi(*this,true); mfi.isValid(); ++mfi) {
                Box const& bx = mfi.growntilebox(nghost);
                if (flags[mfi].getType(bx) != FabType::covered) {
                    auto const& flag = flags.const_array(mfi);
                    auto const& a = this->const_array(mfi);
                    AMREX_LOOP_3D(bx, i, j, k,
                    {
                        if (!flag(i,j,k).isCovered()) {
                            mx = std::max(mx, a(i,j,k,comp));
                        }
                    });
                }
            }
        }
    }
    else
#endif
    {
#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion()) {
            auto const& ma = this->const_arrays();
            mx = ParReduce(TypeList<ReduceOpMax>{}, TypeList<Real>{}, *this, IntVect(nghost),
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Real>
            {
                return ma[box_no](i,j,k,comp);
            });
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:mx)
#endif
            for (MFIter mfi(*this,true); mfi.isValid(); ++mfi) {
                Box const& bx = mfi.growntilebox(nghost);
                auto const& a = this->const_array(mfi);
                AMREX_LOOP_3D(bx, i, j, k,
                {
                    mx = std::max(mx, a(i,j,k,comp));
                });
            }
        }
    }

    if (!local) {
        ParallelAllReduce::Max(mx, ParallelContext::CommunicatorSub());
    }

    return mx;
}